

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receiver_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Receiver_PDU::Receiver_PDU(Receiver_PDU *this)

{
  Radio_Communications_Header::Radio_Communications_Header(&this->super_Radio_Communications_Header)
  ;
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Receiver_PDU_002287b8;
  *(undefined4 *)&(this->super_Radio_Communications_Header).field_0x3a = 0;
  this->m_f32RecPwr = 0.0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TransmitterEntityID);
  this->m_ui16TransmitterRadioID = 0;
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui8PDUType = '\x1b';
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x24;
  return;
}

Assistant:

Receiver_PDU::Receiver_PDU() :
    m_ui16ReceiverState( 0 ),
    m_ui16Padding1( 0 ),
    m_f32RecPwr( 0 ),
    m_ui16TransmitterRadioID( 0 )
{
    m_ui8PDUType = Receiver_PDU_Type;
    m_ui16PDULength = RECEIVER_PDU_SIZE;
}